

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O1

VmInstruction * __thiscall
anon_unknown.dwarf_13465d::CreateInstruction
          (anon_unknown_dwarf_13465d *this,VmModule *module,SynBase *source,VmType type,
          VmInstructionType cmd,VmValue *first,VmValue *second,VmValue *third,VmValue *fourth,
          VmValue *fifth)

{
  uint uniqueId;
  VmInstructionType cmd_00;
  Allocator *allocator;
  bool bVar1;
  VmInstruction *this_00;
  undefined4 in_register_0000008c;
  VmValue *argument;
  VmType type_00;
  
  argument = (VmValue *)CONCAT44(in_register_0000008c,cmd);
  type_00.structType = type._0_8_;
  if (*(long *)(this + 0x30) == 0) {
    __assert_fail("module->currentBlock",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0x127,
                  "VmInstruction *(anonymous namespace)::CreateInstruction(VmModule *, SynBase *, VmType, VmInstructionType, VmValue *, VmValue *, VmValue *, VmValue *, VmValue *)"
                 );
  }
  this_00 = (VmInstruction *)
            (**(code **)(**(long **)(this + 0x15b8) + 0x10))(*(long **)(this + 0x15b8),0x138);
  allocator = *(Allocator **)(this + 0x15b8);
  uniqueId = *(uint *)(*(long *)(this + 0x28) + 0xcc);
  *(uint *)(*(long *)(this + 0x28) + 0xcc) = uniqueId + 1;
  type_00._0_8_ = source;
  VmInstruction::VmInstruction
            (this_00,allocator,type_00,(SynBase *)module,(VmInstructionType)type.structType,uniqueId
            );
  if (argument != (VmValue *)0x0) {
    VmInstruction::AddArgument(this_00,argument);
  }
  if (first != (VmValue *)0x0) {
    if (argument == (VmValue *)0x0) {
      __assert_fail("first",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                    ,0x130,
                    "VmInstruction *(anonymous namespace)::CreateInstruction(VmModule *, SynBase *, VmType, VmInstructionType, VmValue *, VmValue *, VmValue *, VmValue *, VmValue *)"
                   );
    }
    VmInstruction::AddArgument(this_00,first);
  }
  if (second != (VmValue *)0x0) {
    if (first == (VmValue *)0x0) {
      __assert_fail("second",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                    ,0x136,
                    "VmInstruction *(anonymous namespace)::CreateInstruction(VmModule *, SynBase *, VmType, VmInstructionType, VmValue *, VmValue *, VmValue *, VmValue *, VmValue *)"
                   );
    }
    VmInstruction::AddArgument(this_00,second);
  }
  if (third != (VmValue *)0x0) {
    if (second == (VmValue *)0x0) {
      __assert_fail("third",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                    ,0x13c,
                    "VmInstruction *(anonymous namespace)::CreateInstruction(VmModule *, SynBase *, VmType, VmInstructionType, VmValue *, VmValue *, VmValue *, VmValue *, VmValue *)"
                   );
    }
    VmInstruction::AddArgument(this_00,third);
  }
  if (fourth != (VmValue *)0x0) {
    if (third == (VmValue *)0x0) {
      __assert_fail("fourth",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                    ,0x142,
                    "VmInstruction *(anonymous namespace)::CreateInstruction(VmModule *, SynBase *, VmType, VmInstructionType, VmValue *, VmValue *, VmValue *, VmValue *, VmValue *)"
                   );
    }
    VmInstruction::AddArgument(this_00,fourth);
  }
  cmd_00 = this_00->cmd;
  bVar1 = HasSideEffects(cmd_00);
  (this_00->super_VmValue).hasSideEffects = bVar1;
  bVar1 = HasMemoryAccess(cmd_00);
  (this_00->super_VmValue).hasMemoryAccess = bVar1;
  VmBlock::AddInstruction(*(VmBlock **)(this + 0x30),this_00);
  return this_00;
}

Assistant:

VmInstruction* CreateInstruction(VmModule *module, SynBase *source, VmType type, VmInstructionType cmd, VmValue *first, VmValue *second, VmValue *third, VmValue *fourth, VmValue *fifth)
	{
		assert(module->currentBlock);

		VmInstruction *inst = new (module->get<VmInstruction>()) VmInstruction(module->allocator, type, source, cmd, module->currentFunction->nextInstructionId++);

		if(first)
			inst->AddArgument(first);

		if(second)
		{
			assert(first);
			inst->AddArgument(second);
		}

		if(third)
		{
			assert(second);
			inst->AddArgument(third);
		}

		if(fourth)
		{
			assert(third);
			inst->AddArgument(fourth);
		}

		if(fifth)
		{
			assert(fourth);
			inst->AddArgument(fifth);
		}

		inst->hasSideEffects = HasSideEffects(inst->cmd);
		inst->hasMemoryAccess = HasMemoryAccess(inst->cmd);

		module->currentBlock->AddInstruction(inst);

		return inst;
	}